

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O1

IModelVisualization * __thiscall
iDynTree::Visualizer::modelViz(Visualizer *this,string *instanceName)

{
  pointer pcVar1;
  long *local_30 [2];
  long local_20 [2];
  
  pcVar1 = (instanceName->_M_dataplus)._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + instanceName->_M_string_length);
  iDynTree::reportError
            ("Visualizer","getModelInstanceIndex",
             "Impossible to find model instance with the specified name");
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return &(this->pimpl->m_invalidModelViz).super_IModelVisualization;
}

Assistant:

IModelVisualization& Visualizer::modelViz(const std::string& instanceName)
{
    int idx = getModelInstanceIndex(instanceName);
    if( idx < 0 )
    {
        return this->pimpl->m_invalidModelViz;
    }

#ifdef IDYNTREE_USES_IRRLICHT
    return *(this->pimpl->m_modelViz->at(idx));
#else
    return this->pimpl->m_invalidModelViz;
#endif
}